

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRep * __thiscall
absl::cord_internal::CordRepBtree::SubTree(CordRepBtree *this,size_t offset,size_t n)

{
  RefcountAndFlags *pRVar1;
  ulong uVar2;
  CordRep *pCVar3;
  size_t sVar4;
  CordRepBtree *pCVar5;
  long lVar6;
  CordRepSubstring *pCVar7;
  uint uVar8;
  uint8_t uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  CordRepBtree *pCVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  CopyResult CVar19;
  CordRepBtree *local_58;
  CordRepBtree *local_40;
  
  uVar17 = (this->super_CordRep).length;
  if (uVar17 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x386,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (uVar17 - n < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x387,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
  }
  if (n == 0) {
    pCVar5 = (CordRepBtree *)0x0;
  }
  else {
    if (uVar17 <= offset) {
LAB_0017a351:
      __assert_fail("offset < length",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x329,
                    "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                   );
    }
    uVar18 = (ulong)(this->super_CordRep).storage[1];
    uVar17 = this->edges_[uVar18]->length;
    if (uVar17 <= offset) {
      do {
        offset = offset - uVar17;
        lVar6 = uVar18 + 1;
        uVar18 = uVar18 + 1;
        uVar17 = this->edges_[lVar6]->length;
      } while (uVar17 <= offset);
    }
    uVar14 = (uint)(this->super_CordRep).storage[0];
    while( true ) {
      local_40 = (CordRepBtree *)this->edges_[uVar18];
      uVar17 = offset + n;
      uVar2 = (local_40->super_CordRep).length;
      if (uVar2 < uVar17) break;
      if ((int)uVar14 < 1) {
        LOCK();
        pRVar1 = &(local_40->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if (uVar2 == n) {
          return &local_40->super_CordRep;
        }
        pCVar7 = anon_unknown_0::CreateSubstring((CordRep *)local_40,offset,n);
        return &pCVar7->super_CordRep;
      }
      if ((local_40->super_CordRep).tag != '\x03') goto LAB_0017a370;
      if (uVar2 <= offset) goto LAB_0017a351;
      uVar18 = (ulong)(local_40->super_CordRep).storage[1];
      uVar17 = local_40->edges_[uVar18]->length;
      if (uVar17 <= offset) {
        do {
          offset = offset - uVar17;
          lVar6 = uVar18 + 1;
          uVar18 = uVar18 + 1;
          uVar17 = local_40->edges_[lVar6]->length;
        } while (uVar17 <= offset);
      }
      uVar14 = uVar14 - 1;
      this = local_40;
    }
    sVar4 = this->edges_[uVar18]->length;
    uVar12 = uVar18;
    while (sVar4 < uVar17) {
      uVar17 = uVar17 - sVar4;
      lVar6 = uVar12 + 1;
      uVar12 = uVar12 + 1;
      sVar4 = this->edges_[lVar6]->length;
    }
    if (uVar12 <= uVar18) {
      __assert_fail("back.index > front.index",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x397,"CordRep *absl::cord_internal::CordRepBtree::SubTree(size_t, size_t)");
    }
    local_58 = (CordRepBtree *)this->edges_[uVar12];
    if ((int)uVar14 < 1) {
      LOCK();
      pRVar1 = &(local_40->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if (offset != 0) {
        local_40 = (CordRepBtree *)
                   anon_unknown_0::CreateSubstring((CordRep *)local_40,offset,uVar2 - offset);
      }
      if (local_58 == (CordRepBtree *)0x0) {
LAB_0017a332:
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                      ,0x38f,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      pRVar1 = &(local_58->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      if ((local_58->super_CordRep).length != uVar17) {
        if (uVar17 == 0) {
          LOCK();
          pRVar1 = &(local_58->super_CordRep).refcount;
          uVar8 = (pRVar1->count_).super___atomic_base<int>._M_i;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + -2;
          UNLOCK();
          if ((uVar8 & 1) == 0 && (int)uVar8 < 1) {
            __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                          ,0xab,
                          "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                         );
          }
          if (uVar8 == 2) {
            CordRep::Destroy((CordRep *)local_58);
          }
          local_58 = (CordRepBtree *)0x0;
        }
        else {
          local_58 = (CordRepBtree *)anon_unknown_0::CreateSubstring((CordRep *)local_58,0,uVar17);
        }
      }
    }
    else {
      if ((local_40->super_CordRep).tag != '\x03') {
LAB_0017a370:
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      CVar19 = CopySuffix(local_40,offset);
      local_40 = (CordRepBtree *)CVar19.edge;
      if ((local_58->super_CordRep).tag != '\x03') goto LAB_0017a370;
      uVar10 = CVar19.height;
      CVar19 = CopyPrefix(local_58,uVar17,true);
      pCVar5 = (CordRepBtree *)CVar19.edge;
      uVar16 = CVar19.height;
      uVar8 = uVar16;
      if ((int)uVar16 < (int)uVar10) {
        uVar8 = uVar10;
      }
      if (uVar18 + 1 == uVar12) {
        uVar14 = uVar8 + 1;
      }
      if ((int)(uVar10 + 1) < (int)uVar14) {
        iVar11 = ~uVar10 + uVar14;
        pCVar15 = local_40;
        do {
          local_40 = (CordRepBtree *)operator_new(0x40);
          (local_40->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          if ((pCVar15->super_CordRep).tag == '\x03') {
            uVar9 = (pCVar15->super_CordRep).storage[0] + '\x01';
          }
          else {
            uVar9 = '\0';
          }
          (local_40->super_CordRep).length = (pCVar15->super_CordRep).length;
          (local_40->super_CordRep).tag = '\x03';
          (local_40->super_CordRep).storage[0] = uVar9;
          (local_40->super_CordRep).storage[1] = '\0';
          (local_40->super_CordRep).storage[2] = '\x01';
          local_40->edges_[0] = &pCVar15->super_CordRep;
          iVar11 = iVar11 + -1;
          pCVar15 = local_40;
        } while (iVar11 != 0);
      }
      uVar16 = uVar16 + 1;
      local_58 = pCVar5;
      if ((int)uVar16 < (int)uVar14) {
        do {
          local_58 = (CordRepBtree *)operator_new(0x40);
          (local_58->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          if ((pCVar5->super_CordRep).tag == '\x03') {
            uVar9 = (pCVar5->super_CordRep).storage[0] + '\x01';
          }
          else {
            uVar9 = '\0';
          }
          (local_58->super_CordRep).length = (pCVar5->super_CordRep).length;
          (local_58->super_CordRep).tag = '\x03';
          (local_58->super_CordRep).storage[0] = uVar9;
          (local_58->super_CordRep).storage[1] = '\0';
          (local_58->super_CordRep).storage[2] = '\x01';
          local_58->edges_[0] = &pCVar5->super_CordRep;
          uVar16 = uVar16 + 1;
          pCVar5 = local_58;
        } while (uVar14 != uVar16);
      }
    }
    pCVar5 = (CordRepBtree *)operator_new(0x40);
    (pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (pCVar5->super_CordRep).length = 0;
    (pCVar5->super_CordRep).tag = '\x03';
    (pCVar5->super_CordRep).storage[0] = (uint8_t)uVar14;
    (pCVar5->super_CordRep).storage[1] = '\0';
    (pCVar5->super_CordRep).storage[2] = '\0';
    pCVar5->edges_[0] = &local_40->super_CordRep;
    uVar17 = uVar18 + 1;
    if (uVar12 < uVar17) {
      __assert_fail("begin <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x277,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    if (uVar17 < (this->super_CordRep).storage[1]) {
      __assert_fail("begin >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x278,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    if ((this->super_CordRep).storage[2] < uVar12) {
      __assert_fail("end <= this->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x279,
                    "absl::Span<CordRep *const> absl::cord_internal::CordRepBtree::Edges(size_t, size_t) const"
                   );
    }
    lVar6 = 1;
    if (uVar17 != uVar12) {
      lVar13 = uVar12 * 8 + uVar18 * -8 + -8;
      lVar6 = 1;
      do {
        pCVar3 = this->edges_[uVar18 + lVar6];
        if (pCVar3 == (CordRep *)0x0) goto LAB_0017a332;
        LOCK();
        (pCVar3->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar3->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        pCVar5->edges_[lVar6] = pCVar3;
        lVar6 = lVar6 + 1;
        lVar13 = lVar13 + -8;
      } while (lVar13 != 0);
    }
    pCVar5->edges_[lVar6] = &local_58->super_CordRep;
    (pCVar5->super_CordRep).storage[2] = (char)lVar6 + '\x01';
    (pCVar5->super_CordRep).length = n;
    AssertValid(pCVar5,true);
  }
  return &pCVar5->super_CordRep;
}

Assistant:

CordRep* CordRepBtree::SubTree(size_t offset, size_t n) {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return nullptr;

  CordRepBtree* node = this;
  int height = node->height();
  Position front = node->IndexOf(offset);
  CordRep* left = node->edges_[front.index];
  while (front.n + n <= left->length) {
    if (--height < 0) return MakeSubstring(CordRep::Ref(left), front.n, n);
    node = left->btree();
    front = node->IndexOf(front.n);
    left = node->edges_[front.index];
  }

  const Position back = node->IndexBefore(front, n);
  CordRep* const right = node->edges_[back.index];
  assert(back.index > front.index);

  // Get partial suffix and prefix entries.
  CopyResult prefix;
  CopyResult suffix;
  if (height > 0) {
    // Copy prefix and suffix of the boundary nodes.
    prefix = left->btree()->CopySuffix(front.n);
    suffix = right->btree()->CopyPrefix(back.n);

    // If there is an edge between the prefix and suffix edges, then the tree
    // must remain at its previous (full) height. If we have no edges between
    // prefix and suffix edges, then the tree must be as high as either the
    // suffix or prefix edges (which are collapsed to their minimum heights).
    if (front.index + 1 == back.index) {
      height = (std::max)(prefix.height, suffix.height) + 1;
    }

    // Raise prefix and suffixes to the new tree height.
    for (int h = prefix.height + 1; h < height; ++h) {
      prefix.edge = CordRepBtree::New(prefix.edge);
    }
    for (int h = suffix.height + 1; h < height; ++h) {
      suffix.edge = CordRepBtree::New(suffix.edge);
    }
  } else {
    // Leaf node, simply take substrings for prefix and suffix.
    prefix = CopyResult{MakeSubstring(CordRep::Ref(left), front.n), -1};
    suffix = CopyResult{MakeSubstring(CordRep::Ref(right), 0, back.n), -1};
  }

  // Compose resulting tree.
  CordRepBtree* sub = CordRepBtree::New(height);
  size_t end = 0;
  sub->edges_[end++] = prefix.edge;
  for (CordRep* r : node->Edges(front.index + 1, back.index)) {
    sub->edges_[end++] = CordRep::Ref(r);
  }
  sub->edges_[end++] = suffix.edge;
  sub->set_end(end);
  sub->length = n;
  return AssertValid(sub);
}